

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * lest::to_string<(anonymous_namespace)::V>(string *__return_storage_ptr__,V *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  int *value_00;
  ostringstream os;
  string local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  string *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar2 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar2 = *puVar2 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[V:",3);
  string_maker<int>::to_string_abi_cxx11_(&local_1d0,(string_maker<int> *)&value->value,value_00);
  paVar1 = &local_1d0.field_2;
  local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == paVar1) {
    local_1a0._8_8_ = local_1d0.field_2._8_8_;
    local_1b0 = &local_1a0;
  }
  local_1a8 = (string *)local_1d0._M_string_length;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1b0->_M_local_buf,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::stringbuf::str();
  _Var3._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    _Var3._M_p = local_1d0._M_dataplus._M_p;
  }
  local_1d0._M_dataplus._M_p = _Var3._M_p;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1d0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1d0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1d0.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_1d0._M_string_length;
  return (string *)local_1d0._M_string_length;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}